

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

wheelchair_accessible_t parse_wheelchair_accessibility(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(value,""), iVar1 == 0)) {
    return WA_UNKNOWN;
  }
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    return WA_POSSIBLE;
  }
  iVar1 = strcmp(value,"2");
  if (iVar1 == 0) {
    return WA_NOT_POSSIBLE;
  }
  return WA_NOT_SET;
}

Assistant:

wheelchair_accessible_t parse_wheelchair_accessibility(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return WA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return WA_NOT_POSSIBLE;
    else
        return WA_NOT_SET;
}